

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O1

void DoBlending(PalEntry *from,PalEntry *to,int count,int r,int g,int b,int a)

{
  int iVar1;
  long lVar2;
  uint count_00;
  ulong uVar3;
  int iVar4;
  
  if (a == 0x100) {
    if (0 < count) {
      uVar3 = 0;
      do {
        to[uVar3].field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)(g << 8 | r << 0x10 | b);
        uVar3 = uVar3 + 1;
      } while ((uint)count != uVar3);
    }
  }
  else if (a == 0) {
    if (from != to) {
      memcpy(to,from,(long)count << 2);
    }
  }
  else if ((3 < count) && ((CPU.field_6._4_8_ & 0x400000000000000) != 0)) {
    count_00 = count & 0x7ffffffc;
    DoBlending_SSE2(from,to,count_00,r,g,b,a);
    count = count & 3;
    if (count == 0) {
      return;
    }
    to = to + count_00;
    from = from + count_00;
  }
  if (0 < count) {
    iVar1 = 0x100 - a;
    iVar4 = count + 1;
    lVar2 = 2;
    do {
      *(char *)((long)&to->field_0 + lVar2) =
           (char)((uint)*(byte *)((long)&from->field_0 + lVar2) * iVar1 + r * a >> 8);
      *(char *)((long)to + lVar2 + -1) =
           (char)((uint)*(byte *)((long)from + lVar2 + -1) * iVar1 + g * a >> 8);
      *(char *)((long)to + lVar2 + -2) =
           (char)((uint)*(byte *)((long)from + lVar2 + -2) * iVar1 + b * a >> 8);
      lVar2 = lVar2 + 4;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  return;
}

Assistant:

void DoBlending (const PalEntry *from, PalEntry *to, int count, int r, int g, int b, int a)
{
	if (a == 0)
	{
		if (from != to)
		{
			memcpy (to, from, count * sizeof(DWORD));
		}
	}
	else if (a == 256)
	{
		DWORD t = MAKERGB(r,g,b);
		int i;

		for (i = 0; i < count; i++)
		{
			to[i] = t;
		}
	}
#if defined(_M_X64) || defined(_M_IX86) || defined(__i386__) || defined(__amd64__)
	else if (CPU.bSSE2)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_SSE2 (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
#ifdef X86_ASM
	else if (CPU.bMMX)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_MMX (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
	int i, ia;

	ia = 256 - a;
	r *= a;
	g *= a;
	b *= a;

	for (i = count; i > 0; i--, to++, from++)
	{
		to->r = (r + from->r * ia) >> 8;
		to->g = (g + from->g * ia) >> 8;
		to->b = (b + from->b * ia) >> 8;
	}
}